

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O3

string * __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,unsigned_long,void>
::getStorageFilePath_abi_cxx11_
          (string *__return_storage_ptr__,
          SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,unsigned_long,void>
          *this)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = *(long **)(this + 0x20);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = *plVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar2,plVar1[1] + lVar2);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string getStorageFilePath() const noexcept {
        return storageFile_->getPath();
    }